

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqReqRep.cpp
# Opt level: O2

shared_ptr<std::vector<char,_std::allocator<char>_>_> __thiscall
adios2::zmq::ZmqReqRep::Request(ZmqReqRep *this,char *request,size_t size,string *address)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  undefined8 *in_R8;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> sVar7;
  undefined1 auVar8 [16];
  
  sVar7 = std::make_shared<std::vector<char,std::allocator<char>>>();
  uVar3 = zmq_socket(*(undefined8 *)(request + 0x20),3,
                     sVar7.
                     super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi._M_pi);
  iVar1 = 1;
  auVar8 = std::chrono::_V2::system_clock::now();
  lVar5 = auVar8._8_8_;
  do {
    if (iVar1 == 0) {
      iVar1 = -1;
      lVar5 = std::chrono::_V2::system_clock::now();
      goto LAB_0061d7bc;
    }
    iVar1 = zmq_connect(uVar3,*in_R8,lVar5);
    zmq_setsockopt(uVar3,0x1c,request,4);
    zmq_setsockopt(uVar3,0x1b,request,4);
    zmq_setsockopt(uVar3,0x11,request,4);
    lVar4 = std::chrono::_V2::system_clock::now();
    lVar4 = lVar4 - auVar8._0_8_;
    lVar5 = lVar4 % 1000000000;
  } while (lVar4 / 1000000000 <= (long)*(int *)request);
  zmq_close(uVar3);
  _Var6._M_pi = extraout_RDX;
  goto LAB_0061d873;
  while( true ) {
    iVar1 = zmq_send(uVar3,size,address,0);
    lVar4 = std::chrono::_V2::system_clock::now();
    if ((long)*(int *)request < (lVar4 - lVar5) / 1000000000) break;
LAB_0061d7bc:
    if (0 < iVar1) {
      uVar2 = 0xffffffff;
      lVar5 = std::chrono::_V2::system_clock::now();
      goto LAB_0061d808;
    }
  }
  zmq_close(uVar3);
  _Var6._M_pi = extraout_RDX_00;
  goto LAB_0061d873;
  while( true ) {
    uVar2 = zmq_recv(uVar3,*(long *)(request + 8),*(long *)(request + 0x18) - *(long *)(request + 8)
                     ,0);
    lVar4 = std::chrono::_V2::system_clock::now();
    if ((long)*(int *)request < (lVar4 - lVar5) / 1000000000) break;
LAB_0061d808:
    if (0 < (int)uVar2) {
      std::vector<char,_std::allocator<char>_>::resize
                (*(vector<char,_std::allocator<char>_> **)this,(ulong)uVar2);
      memcpy((void *)**(undefined8 **)this,*(void **)(request + 8),(ulong)uVar2);
      zmq_close(uVar3);
      _Var6._M_pi = extraout_RDX_02;
      goto LAB_0061d873;
    }
  }
  zmq_close(uVar3);
  _Var6._M_pi = extraout_RDX_01;
LAB_0061d873:
  sVar7.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  sVar7.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<std::vector<char,_std::allocator<char>_>_>)
         sVar7.
         super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<std::vector<char>> ZmqReqRep::Request(const char *request, const size_t size,
                                                      const std::string &address)
{
    auto reply = std::make_shared<std::vector<char>>();
    void *socket = zmq_socket(m_Context, ZMQ_REQ);

    int ret = 1;
    auto start_time = std::chrono::system_clock::now();
    while (ret)
    {
        ret = zmq_connect(socket, address.c_str());
        zmq_setsockopt(socket, ZMQ_SNDTIMEO, &m_Timeout, sizeof(m_Timeout));
        zmq_setsockopt(socket, ZMQ_RCVTIMEO, &m_Timeout, sizeof(m_Timeout));
        zmq_setsockopt(socket, ZMQ_LINGER, &m_Timeout, sizeof(m_Timeout));

        auto now_time = std::chrono::system_clock::now();
        auto duration = std::chrono::duration_cast<std::chrono::seconds>(now_time - start_time);
        if (duration.count() > m_Timeout)
        {
            zmq_close(socket);
            return reply;
        }
    }

    ret = -1;
    start_time = std::chrono::system_clock::now();
    while (ret < 1)
    {
        ret = zmq_send(socket, request, size, 0);
        auto now_time = std::chrono::system_clock::now();
        auto duration = std::chrono::duration_cast<std::chrono::seconds>(now_time - start_time);
        if (duration.count() > m_Timeout)
        {
            zmq_close(socket);
            return reply;
        }
    }

    ret = -1;
    start_time = std::chrono::system_clock::now();
    while (ret < 1)
    {
        ret = zmq_recv(socket, m_ReceiverBuffer.data(), m_ReceiverBuffer.capacity(), 0);
        auto now_time = std::chrono::system_clock::now();
        auto duration = std::chrono::duration_cast<std::chrono::seconds>(now_time - start_time);
        if (duration.count() > m_Timeout)
        {
            zmq_close(socket);
            return reply;
        }
    }

    reply->resize(ret);
    std::memcpy(reply->data(), m_ReceiverBuffer.data(), ret);
    zmq_close(socket);
    return reply;
}